

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O2

BOOL __thiscall Js::DynamicObject::Freeze(DynamicObject *this)

{
  Type *pTVar1;
  int iVar2;
  DynamicTypeHandler *pDVar3;
  
  pTVar1 = (this->super_RecyclableObject).type.ptr;
  pDVar3 = GetTypeHandler(this);
  iVar2 = (*pDVar3->_vptr_DynamicTypeHandler[99])(pDVar3,this,0);
  if ((this->super_RecyclableObject).type.ptr == pTVar1) {
    ChangeType(this);
  }
  return iVar2;
}

Assistant:

BOOL DynamicObject::Freeze()
    {
        Type* oldType = this->GetType();
        BOOL ret = GetTypeHandler()->Freeze(this);

        // We just made all properties on this object non-writable.
        // Make sure the type is evolved so that the property string caches
        // are no longer hit.
        if (this->GetType() == oldType)
        {
            this->ChangeType();
        }

        return ret;
    }